

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O1

void lws_dump_header(lws *wsi,int hdr)

{
  uint uVar1;
  uchar *puVar2;
  uchar *puVar3;
  char s [200];
  char local_d8 [200];
  
  if (hdr == 0xffff) {
    _lws_log(4,"hdr tok ignored\n");
    return;
  }
  uVar1 = lws_hdr_copy(wsi,local_d8,199,hdr);
  if ((int)uVar1 < 0) {
    builtin_strncpy(local_d8,"(too big to show)",0x12);
  }
  else {
    local_d8[uVar1] = '\0';
  }
  puVar2 = lws_token_to_string(hdr);
  puVar3 = (uchar *)"null";
  if (puVar2 != (uchar *)0x0) {
    puVar3 = puVar2;
  }
  _lws_log(0x40,"  hdr tok %d (%s) = \'%s\' (len %d)\n",(ulong)(uint)hdr,puVar3,local_d8,
           (ulong)uVar1);
  return;
}

Assistant:

static void lws_dump_header(struct lws *wsi, int hdr)
{
	char s[200];
	const unsigned char *p;
	int len;

	if (hdr == LWS_HPACK_IGNORE_ENTRY) {
		lwsl_notice("hdr tok ignored\n");
		return;
	}

	(void)p;

	len = lws_hdr_copy(wsi, s, sizeof(s) - 1, (enum lws_token_indexes)hdr);
	if (len < 0)
		strcpy(s, "(too big to show)");
	else
		s[len] = '\0';
#if defined(_DEBUG)
	p = lws_token_to_string((enum lws_token_indexes)hdr);
	lwsl_header("  hdr tok %d (%s) = '%s' (len %d)\n", hdr,
		   p ? (char *)p : (char *)"null", s, len);
#endif
}